

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O0

unsigned_short __thiscall
libdivide::divider<unsigned_short,_(libdivide::Branching)1>::recover
          (divider<unsigned_short,_(libdivide::Branching)1> *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  divider<unsigned_short,_(libdivide::Branching)1> *this_local;
  uint16_t full_q;
  uint32_t rem;
  uint16_t half_q;
  uint32_t d;
  uint32_t half_n;
  uint8_t shift;
  uint8_t more;
  unsigned_short local_2;
  
  bVar1 = (this->div).denom.more & 0x1f;
  if ((this->div).denom.magic == 0) {
    local_2 = (unsigned_short)(1 << (bVar1 + 1 & 0x1f));
  }
  else {
    uVar2 = 1 << (bVar1 + 0x10 & 0x1f);
    uVar3 = (this->div).denom.magic | 0x10000;
    local_2 = (short)(uVar2 / uVar3) * 2 + (ushort)(uVar3 <= uVar2 % uVar3 << 1) + 1;
  }
  return local_2;
}

Assistant:

T recover() const { return div.recover(); }